

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O0

void __thiscall CVmImageLoader::~CVmImageLoader(CVmImageLoader *this)

{
  void *pvVar1;
  undefined8 uVar2;
  undefined8 *in_RDI;
  CVmStaticInitPage *nxt;
  size_t i;
  CVmRuntimeSymbols *in_stack_ffffffffffffffb0;
  CVmHashTable *this_00;
  ulong local_10;
  
  for (local_10 = 0; local_10 < 2; local_10 = local_10 + 1) {
    if ((long *)in_RDI[local_10 + 8] != (long *)0x0) {
      (**(code **)(*(long *)in_RDI[local_10 + 8] + 8))();
    }
  }
  lib_free_str((char *)0x3094b9);
  lib_free_str((char *)0x3094c9);
  if ((in_RDI[0xc] != 0) && (pvVar1 = (void *)in_RDI[0xc], pvVar1 != (void *)0x0)) {
    CVmRuntimeSymbols::~CVmRuntimeSymbols(in_stack_ffffffffffffffb0);
    operator_delete(pvVar1,0x18);
  }
  if ((in_RDI[0xd] != 0) && (pvVar1 = (void *)in_RDI[0xd], pvVar1 != (void *)0x0)) {
    CVmRuntimeSymbols::~CVmRuntimeSymbols(in_stack_ffffffffffffffb0);
    operator_delete(pvVar1,0x18);
  }
  this_00 = (CVmHashTable *)in_RDI[10];
  if (this_00 != (CVmHashTable *)0x0) {
    CVmHashTable::~CVmHashTable(this_00);
    operator_delete(this_00,0x20);
  }
  pvVar1 = (void *)in_RDI[0xb];
  if (pvVar1 != (void *)0x0) {
    CVmHashTable::~CVmHashTable(this_00);
    operator_delete(pvVar1,0x20);
  }
  while (in_RDI[0xf] != 0) {
    uVar2 = *(undefined8 *)in_RDI[0xf];
    (**(code **)(*(long *)*in_RDI + 0x30))((long *)*in_RDI,*(undefined8 *)(in_RDI[0xf] + 0x10));
    if ((void *)in_RDI[0xf] != (void *)0x0) {
      operator_delete((void *)in_RDI[0xf],0x18);
    }
    in_RDI[0xf] = uVar2;
  }
  return;
}

Assistant:

CVmImageLoader::~CVmImageLoader()
{
    size_t i;

    /* delete the pool tracking objects */
    for (i = 0 ; i < sizeof(pools_)/sizeof(pools_[0]) ; ++i)
        delete pools_[i];

    /* delete the filename string and path */
    lib_free_str(fname_);
    lib_free_str(path_);

    /* if we have our own runtime symbol/macro tables, delete them */
    if (runtime_symtab_ != 0)
        delete runtime_symtab_;
    if (runtime_macros_ != 0)
        delete runtime_macros_;

    /* delete the exports tables */
    delete exports_;
    delete synth_exports_;

    /* delete the static initializer pages */
    while (static_head_ != 0)
    {
        CVmStaticInitPage *nxt;
        
        /* remember the next one */
        nxt = static_head_->nxt_;

        /* free the image-allocated data associated with the page */
        fp_->free_mem(static_head_->data_);

        /* delete this one */
        delete static_head_;

        /* move on to the next */
        static_head_ = nxt;
    }
}